

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O3

bool __thiscall SM_Manager::isValidAttrType(SM_Manager *this,AttrInfo attribute)

{
  bool bVar1;
  
  bVar1 = true;
  if (FLOAT < attribute.attrType || attribute._8_8_ >> 0x20 != 4) {
    bVar1 = attribute.attrLength - 1U < 0xfe && attribute.attrType == STRING;
  }
  return bVar1;
}

Assistant:

bool SM_Manager::isValidAttrType(AttrInfo attribute){

  AttrType type = attribute.attrType;
  int length = attribute.attrLength;
  if(type == INT && length == 4)
    return true;
  if(type == FLOAT && length == 4)
    return true;
  if(type == STRING && (length > 0) && length < MAXSTRINGLEN)
    return true;

  return false;
}